

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

RegexMatcher * __thiscall icu_63::RegexMatcher::reset(RegexMatcher *this)

{
  RegexMatcher *this_local;
  
  this->fRegionStart = 0;
  this->fRegionLimit = this->fInputLength;
  this->fActiveStart = 0;
  this->fActiveLimit = this->fInputLength;
  this->fAnchorStart = 0;
  this->fAnchorLimit = this->fInputLength;
  this->fLookStart = 0;
  this->fLookLimit = this->fInputLength;
  resetPreserveRegion(this);
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::reset() {
    fRegionStart    = 0;
    fRegionLimit    = fInputLength;
    fActiveStart    = 0;
    fActiveLimit    = fInputLength;
    fAnchorStart    = 0;
    fAnchorLimit    = fInputLength;
    fLookStart      = 0;
    fLookLimit      = fInputLength;
    resetPreserveRegion();
    return *this;
}